

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * __thiscall Matrix4f::transposed(Matrix4f *this)

{
  float fVar1;
  float *pfVar2;
  Matrix4f *in_RSI;
  Matrix4f *in_RDI;
  int j;
  int i;
  Matrix4f *out;
  undefined4 local_18;
  undefined4 local_14;
  
  Matrix4f(in_RDI,0.0);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      pfVar2 = operator()(in_RSI,local_14,local_18);
      fVar1 = *pfVar2;
      pfVar2 = operator()(in_RDI,local_18,local_14);
      *pfVar2 = fVar1;
    }
  }
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::transposed() const
{
	Matrix4f out;
	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}